

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa-verify.c
# Opt level: O1

int dsa_verify_hash(uint8_t *sha1,char *pubkey,char *sig)

{
  int iVar1;
  size_t len;
  size_t inlen;
  uchar *out;
  uchar *out_00;
  size_t pubkey_len;
  size_t sig_len;
  SHA1_t sha1sum;
  uchar auStack_48 [24];
  
  SHA1(auStack_48,(size_t)sha1,(uchar *)0x14);
  len = strlen(pubkey);
  inlen = strlen(sig);
  out = (uchar *)malloc((ulong)(uint)((int)(len >> 2) * 3));
  out_00 = (uchar *)malloc((ulong)(uint)((int)(inlen >> 2) * 3));
  pubkey_len = pem2der(pubkey,len,out);
  if (pubkey_len == 0) {
    iVar1 = -2;
  }
  else {
    sig_len = base64_decode(sig,inlen,out_00);
    if (sig_len == 0) {
      iVar1 = -4;
    }
    else {
      iVar1 = dsa_verify_hash_der(auStack_48,out,pubkey_len,out_00,sig_len);
    }
  }
  free(out);
  free(out_00);
  return iVar1;
}

Assistant:

int dsa_verify_hash(const SHA1_t sha1, const char* pubkey, const char* sig)
{
	SHA1_t sha1sum;
	SHA1(sha1sum, (const unsigned char*)sha1, sizeof(SHA1_t));

	size_t key_len = strlen(pubkey);
	size_t sig_len = strlen(sig);

	int ret;
	unsigned char* key_der = malloc(BASE64_DECODE_OUT_SIZE(key_len));
	unsigned char* sig_der = malloc(BASE64_DECODE_OUT_SIZE(sig_len));

	if((key_len = pem2der(pubkey, key_len, key_der)) == 0)
	{
		ret = DSA_KEY_FORMAT_ERROR;
		goto error;
	}

	if((sig_len = base64_decode(sig, sig_len, sig_der)) == 0)
	{
		ret = DSA_SIGNATURE_FORMAT_ERROR;
		goto error;
	}

	ret = dsa_verify_hash_der(sha1sum, key_der, key_len, sig_der, sig_len);

error:
	free(key_der);
	free(sig_der);

	return ret;
}